

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_stats.c
# Opt level: O3

void cram_stats_add(cram_stats *st,int32_t val)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  khint32_t *pkVar5;
  int iVar6;
  kh_m_i2i_t *h;
  sbyte sVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  khint_t new_n_buckets;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  bool bVar16;
  
  st->nsamp = st->nsamp + 1;
  if ((uint)val < 0x400) {
    st->freqs[(uint)val] = st->freqs[(uint)val] + 1;
  }
  else {
    h = st->h;
    if (h == (kh_m_i2i_t *)0x0) {
      h = (kh_m_i2i_t *)calloc(1,0x28);
      st->h = h;
    }
    if (h->upper_bound <= h->n_occupied) {
      uVar11 = h->n_buckets;
      if (h->size * 2 < uVar11) {
        new_n_buckets = uVar11 - 1;
      }
      else {
        new_n_buckets = uVar11 + 1;
      }
      iVar6 = kh_resize_m_i2i(h,new_n_buckets);
      if (iVar6 < 0) {
        return;
      }
    }
    uVar11 = h->n_buckets;
    uVar12 = uVar11 - 1 & val;
    pkVar5 = h->flags;
    if ((pkVar5[uVar12 >> 4] >> ((char)uVar12 * '\x02' & 0x1fU) & 2) == 0) {
      iVar6 = 1;
      uVar10 = uVar11;
      uVar13 = uVar12;
      do {
        uVar4 = pkVar5[uVar13 >> 4];
        uVar9 = uVar13 * 2 & 0x1e;
        sVar7 = (sbyte)uVar9;
        uVar14 = uVar4 >> sVar7;
        if (((uVar14 & 2) != 0) || (((uVar14 & 1) == 0 && (h->keys[uVar13] == val)))) {
          bVar16 = (uVar4 >> sVar7 & 2) == 0;
          goto LAB_0012a514;
        }
        if ((uVar4 >> uVar9 & 1) != 0) {
          uVar10 = uVar13;
        }
        uVar13 = uVar13 + iVar6 & uVar11 - 1;
        iVar6 = iVar6 + 1;
      } while (uVar13 != uVar12);
      bVar16 = true;
      bVar15 = uVar10 == uVar11;
      uVar13 = uVar12;
      uVar12 = uVar10;
      uVar10 = uVar11;
      if (bVar15) {
LAB_0012a514:
        if (uVar10 == uVar11) {
          uVar10 = uVar13;
        }
        uVar12 = uVar10;
        if (bVar16) {
          uVar12 = uVar13;
        }
      }
    }
    uVar11 = uVar12 >> 4;
    bVar8 = (char)uVar12 * '\x02' & 0x1e;
    if ((pkVar5[uVar11] >> bVar8 & 2) == 0) {
      if ((pkVar5[uVar11] >> bVar8 & 1) == 0) {
        piVar1 = st->h->vals + uVar12;
        *piVar1 = *piVar1 + 1;
        return;
      }
      h->keys[uVar12] = val;
      pkVar5[uVar11] = pkVar5[uVar11] & ~(3 << bVar8);
      h->size = h->size + 1;
    }
    else {
      h->keys[uVar12] = val;
      pkVar5[uVar11] = pkVar5[uVar11] & ~(3 << bVar8);
      uVar2 = h->size;
      uVar3 = h->n_occupied;
      h->size = uVar2 + 1;
      h->n_occupied = uVar3 + 1;
    }
    st->h->vals[uVar12] = 1;
  }
  return;
}

Assistant:

void cram_stats_add(cram_stats *st, int32_t val) {
    st->nsamp++;

    //assert(val >= 0);

    if (val < MAX_STAT_VAL && val >= 0) {
	st->freqs[val]++;
    } else {
	khint_t k;
	int r;

	if (!st->h) {
	    st->h = kh_init(m_i2i);
	}

	k = kh_put(m_i2i, st->h, val, &r);
	if (r == 0)
	    kh_val(st->h, k)++;
	else if (r != -1)
	    kh_val(st->h, k) = 1;
	else
	    ; // FIXME: handle error
    }
}